

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TreeFormatter.cpp
# Opt level: O3

void __thiscall
cali::TreeFormatter::TreeFormatterImpl::add
          (TreeFormatterImpl *this,CaliperMetadataAccessInterface *db,EntryList *list)

{
  pointer ppVar1;
  int iVar2;
  SnapshotTreeNode *pSVar3;
  iterator iVar4;
  iterator iVar5;
  undefined4 extraout_var;
  pointer __k;
  cali_attr_type cVar6;
  _Rb_tree<cali::Attribute,std::pair<cali::Attribute_const,cali::TreeFormatter::TreeFormatterImpl::ColumnInfo>,std::_Select1st<std::pair<cali::Attribute_const,cali::TreeFormatter::TreeFormatterImpl::ColumnInfo>>,std::less<cali::Attribute>,std::allocator<std::pair<cali::Attribute_const,cali::TreeFormatter::TreeFormatterImpl::ColumnInfo>>>
  *this_00;
  vector<cali::Attribute,_std::allocator<cali::Attribute>_> path_keys;
  ColumnInfo ci;
  string name;
  undefined1 local_128 [8];
  _Alloc_hider local_120;
  undefined1 local_118 [8];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_110;
  cali_attr_type local_100;
  cali_variant_t local_f8;
  undefined1 local_e8 [24];
  undefined1 local_d0 [32];
  pointer local_b0;
  anon_union_8_7_33918203_for_value local_a8;
  CaliperMetadataAccessInterface *local_a0;
  _Rb_tree<cali::Attribute,std::pair<cali::Attribute_const,cali::TreeFormatter::TreeFormatterImpl::ColumnInfo>,std::_Select1st<std::pair<cali::Attribute_const,cali::TreeFormatter::TreeFormatterImpl::ColumnInfo>>,std::less<cali::Attribute>,std::allocator<std::pair<cali::Attribute_const,cali::TreeFormatter::TreeFormatterImpl::ColumnInfo>>>
  *local_98;
  _Base_ptr local_90;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_88;
  Attribute local_80;
  _Any_data local_78;
  code *local_68;
  code *local_60;
  _Any_data local_50;
  code *local_40;
  code *local_38;
  
  local_a0 = db;
  if (this->m_use_nested == true) {
    local_78._M_unused._M_object = (void *)0x0;
    local_78._8_8_ = 0;
    local_60 = std::
               _Function_handler<bool_(const_cali::Attribute_&,_const_cali::Variant_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]Caliper/src/reader/TreeFormatter.cpp:148:47)>
               ::_M_invoke;
    local_68 = std::
               _Function_handler<bool_(const_cali::Attribute_&,_const_cali::Variant_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]Caliper/src/reader/TreeFormatter.cpp:148:47)>
               ::_M_manager;
    pSVar3 = SnapshotTree::add_snapshot(&this->m_tree,db,list,(IsPathPredicateFn *)&local_78);
    if (local_68 != (code *)0x0) {
      (*local_68)(&local_78,&local_78,__destroy_functor);
    }
  }
  else {
    get_path_keys((vector<cali::Attribute,_std::allocator<cali::Attribute>_> *)local_128,this,db);
    local_50._8_8_ = 0;
    local_38 = std::
               _Function_handler<bool_(const_cali::Attribute_&,_const_cali::Variant_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]Caliper/src/reader/TreeFormatter.cpp:152:50)>
               ::_M_invoke;
    local_40 = std::
               _Function_handler<bool_(const_cali::Attribute_&,_const_cali::Variant_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]Caliper/src/reader/TreeFormatter.cpp:152:50)>
               ::_M_manager;
    local_50._M_unused._M_object = local_128;
    pSVar3 = SnapshotTree::add_snapshot(&this->m_tree,db,list,(IsPathPredicateFn *)&local_50);
    if (local_40 != (code *)0x0) {
      (*local_40)(&local_50,&local_50,__destroy_functor);
    }
    if (local_128 != (undefined1  [8])0x0) {
      operator_delete((void *)local_128,(long)local_118 - (long)local_128);
    }
  }
  if (pSVar3 != (SnapshotTreeNode *)0x0) {
    local_a8 = (anon_union_8_7_33918203_for_value)
               (pSVar3->m_records).
               super__Vector_base<std::vector<std::pair<cali::Attribute,_cali::Variant>,_std::allocator<std::pair<cali::Attribute,_cali::Variant>_>_>,_std::allocator<std::vector<std::pair<cali::Attribute,_cali::Variant>,_std::allocator<std::pair<cali::Attribute,_cali::Variant>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    local_b0 = (pSVar3->m_records).
               super__Vector_base<std::vector<std::pair<cali::Attribute,_cali::Variant>,_std::allocator<std::pair<cali::Attribute,_cali::Variant>_>_>,_std::allocator<std::vector<std::pair<cali::Attribute,_cali::Variant>,_std::allocator<std::pair<cali::Attribute,_cali::Variant>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    if ((pointer)local_a8.v_uint != local_b0) {
      this_00 = (_Rb_tree<cali::Attribute,std::pair<cali::Attribute_const,cali::TreeFormatter::TreeFormatterImpl::ColumnInfo>,std::_Select1st<std::pair<cali::Attribute_const,cali::TreeFormatter::TreeFormatterImpl::ColumnInfo>>,std::less<cali::Attribute>,std::allocator<std::pair<cali::Attribute_const,cali::TreeFormatter::TreeFormatterImpl::ColumnInfo>>>
                 *)&this->m_column_info;
      local_88 = &(this->m_spec).aliases;
      local_90 = &(this->m_spec).aliases._M_t._M_impl.super__Rb_tree_header._M_header;
      local_98 = this_00;
      do {
        ppVar1 = *(pointer *)(local_a8.v_uint + 8);
        for (__k = *local_a8.unmanaged_ptr; __k != ppVar1; __k = __k + 1) {
          Variant::to_string_abi_cxx11_((string *)local_128,&__k->second);
          cVar6 = (cali_attr_type)local_120._M_p;
          if (local_128 != (undefined1  [8])local_118) {
            operator_delete((void *)local_128,(ulong)((long)local_118 + 1));
          }
          iVar4 = std::
                  _Rb_tree<cali::Attribute,_std::pair<const_cali::Attribute,_cali::TreeFormatter::TreeFormatterImpl::ColumnInfo>,_std::_Select1st<std::pair<const_cali::Attribute,_cali::TreeFormatter::TreeFormatterImpl::ColumnInfo>_>,_std::less<cali::Attribute>,_std::allocator<std::pair<const_cali::Attribute,_cali::TreeFormatter::TreeFormatterImpl::ColumnInfo>_>_>
                  ::find((_Rb_tree<cali::Attribute,_std::pair<const_cali::Attribute,_cali::TreeFormatter::TreeFormatterImpl::ColumnInfo>,_std::_Select1st<std::pair<const_cali::Attribute,_cali::TreeFormatter::TreeFormatterImpl::ColumnInfo>_>,_std::less<cali::Attribute>,_std::allocator<std::pair<const_cali::Attribute,_cali::TreeFormatter::TreeFormatterImpl::ColumnInfo>_>_>
                          *)this_00,&__k->first);
          if ((_Rb_tree_header *)iVar4._M_node ==
              &(this->m_column_info)._M_t._M_impl.super__Rb_tree_header) {
            Attribute::name_abi_cxx11_((string *)(local_e8 + 0x18),&__k->first);
            iVar5 = CaliperMetadataDB::std::
                    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)local_88,(key_type *)(local_e8 + 0x18));
            if (iVar5._M_node == local_90) {
              local_128 = (undefined1  [8])local_118;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_128,"attribute.alias","");
              iVar2 = (*local_a0->_vptr_CaliperMetadataAccessInterface[2])(local_a0,local_128);
              local_80.m_node = (Node *)CONCAT44(extraout_var,iVar2);
              local_f8 = (cali_variant_t)Attribute::get(&__k->first,&local_80);
              if (local_128 != (undefined1  [8])local_118) {
                operator_delete((void *)local_128,(ulong)((long)local_118 + 1));
              }
              if ((Node *)local_f8.type_and_size != (Node *)0x0) {
                Variant::to_string_abi_cxx11_((string *)local_128,(Variant *)&local_f8);
                std::__cxx11::string::operator=((string *)(local_e8 + 0x18),(string *)local_128);
                if (local_128 != (undefined1  [8])local_118) {
                  operator_delete((void *)local_128,(ulong)((long)local_118 + 1));
                }
              }
            }
            else {
              std::__cxx11::string::_M_assign((string *)(local_e8 + 0x18));
            }
            local_f8.type_and_size = (uint64_t)local_e8;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_f8,local_d0._0_8_,
                       (undefined1 *)
                       ((long)&((LockfreeIntrusiveTree<cali::Node> *)local_d0._0_8_)->m_me +
                       CONCAT44(local_d0._12_4_,local_d0._8_4_)));
            local_e8._16_4_ = local_d0._8_4_;
            if ((int)local_d0._8_4_ < (int)cVar6) {
              local_e8._16_4_ = cVar6;
            }
            local_128 = (undefined1  [8])(__k->first).m_node;
            local_120._M_p = local_118 + 8;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_120,local_f8.type_and_size,
                       (long)local_f8.value.unmanaged_ptr + local_f8.type_and_size);
            this_00 = local_98;
            local_100 = local_e8._16_4_;
            std::
            _Rb_tree<cali::Attribute,std::pair<cali::Attribute_const,cali::TreeFormatter::TreeFormatterImpl::ColumnInfo>,std::_Select1st<std::pair<cali::Attribute_const,cali::TreeFormatter::TreeFormatterImpl::ColumnInfo>>,std::less<cali::Attribute>,std::allocator<std::pair<cali::Attribute_const,cali::TreeFormatter::TreeFormatterImpl::ColumnInfo>>>
            ::
            _M_emplace_unique<std::pair<cali::Attribute,cali::TreeFormatter::TreeFormatterImpl::ColumnInfo>>
                      (local_98,(pair<cali::Attribute,_cali::TreeFormatter::TreeFormatterImpl::ColumnInfo>
                                 *)local_128);
            if ((pointer)local_120._M_p != (pointer)(local_118 + 8)) {
              operator_delete(local_120._M_p,local_110._0_8_ + 1);
            }
            if ((Node *)local_f8.type_and_size != (Node *)local_e8) {
              operator_delete((void *)local_f8.type_and_size,
                              (ulong)((long)&((LockfreeIntrusiveTree<cali::Node> *)local_e8._0_8_)->
                                             m_me + 1));
            }
            if ((undefined1 *)local_d0._0_8_ != local_d0 + 0x10) {
              operator_delete((void *)local_d0._0_8_,(ulong)(local_d0._16_8_ + 1));
            }
          }
          else {
            if ((int)cVar6 < (int)*(cali_attr_type *)&iVar4._M_node[2]._M_parent) {
              cVar6 = *(cali_attr_type *)&iVar4._M_node[2]._M_parent;
            }
            *(cali_attr_type *)&iVar4._M_node[2]._M_parent = cVar6;
          }
        }
        local_a8.unmanaged_ptr = (void *)(local_a8.v_uint + 0x18);
      } while ((pointer)local_a8.v_uint != local_b0);
    }
  }
  return;
}

Assistant:

void add(const CaliperMetadataAccessInterface& db, const EntryList& list)
    {
        const SnapshotTreeNode* node = nullptr;

        if (m_use_nested) {
            node =
                m_tree.add_snapshot(db, list, [](const Attribute& attr, const Variant&) { return attr.is_nested(); });
        } else {
            auto path_keys = get_path_keys(db);

            node = m_tree.add_snapshot(db, list, [&path_keys](const Attribute& attr, const Variant&) {
                return (std::find(std::begin(path_keys), std::end(path_keys), attr) != std::end(path_keys));
            });
        }

        if (!node)
            return;

        // update column widths

        for (auto& data : node->records()) {
            for (auto& entry : data) {
                int  len = entry.second.to_string().size();
                auto it  = m_column_info.find(entry.first);

                if (it == m_column_info.end()) {
                    std::string name = entry.first.name();

                    auto ait = m_spec.aliases.find(name);
                    if (ait != m_spec.aliases.end())
                        name = ait->second;
                    else {
                        Variant v = entry.first.get(db.get_attribute("attribute.alias"));

                        if (!v.empty())
                            name = v.to_string();
                    }

                    ColumnInfo ci { name, std::max<int>(len, name.size()) };

                    m_column_info.insert(std::make_pair(entry.first, ci));
                } else
                    it->second.width = std::max(it->second.width, len);
            }
        }
    }